

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

void duckdb::WriteData<duckdb::string_t,duckdb_blob,duckdb::CBlobConverter>
               (duckdb_column *column,ColumnDataCollection *source,
               vector<unsigned_long,_true> *column_ids)

{
  undefined8 *puVar1;
  string_t input;
  bool bVar2;
  DataChunk *this;
  reference vector;
  long lVar3;
  idx_t k;
  ulong row_idx;
  long lVar4;
  duckdb_blob dVar5;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterator __end2;
  void *pvVar6;
  void *pvVar7;
  ColumnDataChunkIterationHelper local_1a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  pvVar6 = column->deprecated_data;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::Chunks(&local_1a8,source,(vector<unsigned_long,_true> *)&local_188);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_188);
  ColumnDataChunkIterationHelper::begin(&local_170,&local_1a8);
  ColumnDataChunkIterationHelper::end(&local_d0,&local_1a8);
  lVar4 = 0;
  while( true ) {
    bVar2 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                      (&local_170,&local_d0);
    if (!bVar2) break;
    this = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_170);
    vector<duckdb::Vector,_true>::get<true>(&this->data,0);
    vector = vector<duckdb::Vector,_true>::get<true>(&this->data,0);
    FlatVector::VerifyFlatVector(vector);
    lVar3 = 0;
    pvVar7 = pvVar6;
    for (row_idx = 0; row_idx < this->count; row_idx = row_idx + 1) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar2) {
        input.value.pointer.ptr = (char *)pvVar7;
        input.value._0_8_ = 0x1a373c2;
        dVar5 = CBlobConverter::Convert<duckdb::string_t,duckdb_blob>(input);
        *(void **)((long)pvVar6 + lVar3 + lVar4 * 0x10) = dVar5.data;
        *(idx_t *)((long)pvVar6 + lVar3 + lVar4 * 0x10 + 8) = dVar5.size;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar6 + lVar3 + lVar4 * 0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      lVar3 = lVar3 + 0x10;
    }
    lVar4 = lVar4 + row_idx;
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_170);
    pvVar6 = pvVar7;
  }
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_d0);
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_170);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8.column_ids);
  return;
}

Assistant:

void WriteData(duckdb_column *column, ColumnDataCollection &source, const vector<column_t> &column_ids) {
	idx_t row = 0;
	auto target = (DST *)column->deprecated_data;
	for (auto &input : source.Chunks(column_ids)) {
		auto source = FlatVector::GetData<SRC>(input.data[0]);
		auto &mask = FlatVector::Validity(input.data[0]);

		for (idx_t k = 0; k < input.size(); k++, row++) {
			if (!mask.RowIsValid(k)) {
				OP::template NullConvert<DST>(target[row]);
			} else {
				target[row] = OP::template Convert<SRC, DST>(source[k]);
			}
		}
	}
}